

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

void __thiscall
RegVmLoweredFunction::FreeDelayedRegisters(RegVmLoweredFunction *this,RegVmLoweredBlock *lowBlock)

{
  RegVmLoweredInstruction *pRVar1;
  bool bVar2;
  uint uVar3;
  uchar *puVar4;
  uint local_1c;
  uint i;
  RegVmLoweredBlock *lowBlock_local;
  RegVmLoweredFunction *this_local;
  
  local_1c = 0;
  while( true ) {
    uVar3 = SmallArray<unsigned_char,_16U>::size(&this->delayedFreedRegisters);
    if (uVar3 <= local_1c) {
      SmallArray<unsigned_char,_16U>::clear(&this->delayedFreedRegisters);
      return;
    }
    if (lowBlock == (RegVmLoweredBlock *)0x0) {
      puVar4 = SmallArray<unsigned_char,_16U>::operator[](&this->delayedFreedRegisters,local_1c);
      SmallArray<unsigned_char,_16U>::push_back(&this->killedRegisters,puVar4);
    }
    else {
      pRVar1 = lowBlock->lastInstruction;
      puVar4 = SmallArray<unsigned_char,_16U>::operator[](&this->delayedFreedRegisters,local_1c);
      SmallArray<unsigned_char,_8U>::push_back(&pRVar1->postKillRegisters,puVar4);
    }
    puVar4 = SmallArray<unsigned_char,_16U>::operator[](&this->delayedFreedRegisters,local_1c);
    bVar2 = SmallArray<unsigned_char,_16U>::contains(&this->freedRegisters,puVar4);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    puVar4 = SmallArray<unsigned_char,_16U>::operator[](&this->delayedFreedRegisters,local_1c);
    SmallArray<unsigned_char,_16U>::push_back(&this->freedRegisters,puVar4);
    local_1c = local_1c + 1;
  }
  __assert_fail("!freedRegisters.contains(delayedFreedRegisters[i])",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                ,0xd8,"void RegVmLoweredFunction::FreeDelayedRegisters(RegVmLoweredBlock *)");
}

Assistant:

void RegVmLoweredFunction::FreeDelayedRegisters(RegVmLoweredBlock *lowBlock)
{
	for(unsigned i = 0; i < delayedFreedRegisters.size(); i++)
	{
		if(lowBlock)
			lowBlock->lastInstruction->postKillRegisters.push_back(delayedFreedRegisters[i]);
		else
			killedRegisters.push_back(delayedFreedRegisters[i]);

		assert(!freedRegisters.contains(delayedFreedRegisters[i]));
		freedRegisters.push_back(delayedFreedRegisters[i]);
	}

	delayedFreedRegisters.clear();
}